

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

void plutovg_text_iterator_init
               (plutovg_text_iterator_t *it,void *text,int length,plutovg_text_encoding_t encoding)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)length;
  if (length == -1) {
    if (encoding < PLUTOVG_TEXT_ENCODING_UTF16) {
      if (*text != '\0') {
        uVar2 = 0;
        do {
          lVar1 = uVar2 + 1;
          uVar2 = uVar2 + 1;
        } while (*(char *)((long)text + lVar1) != '\0');
        goto LAB_0010458d;
      }
    }
    else if (encoding == PLUTOVG_TEXT_ENCODING_UTF16) {
      if (*text != 0) {
        uVar2 = 0;
        do {
          lVar1 = uVar2 * 2;
          uVar2 = uVar2 + 1;
        } while (*(short *)((long)text + lVar1 + 2) != 0);
        goto LAB_0010458d;
      }
    }
    else {
      if (encoding != PLUTOVG_TEXT_ENCODING_UTF32) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                      ,0x20,
                      "int plutovg_text_iterator_length(const void *, plutovg_text_encoding_t)");
      }
      if (*text != 0) {
        uVar2 = 0;
        do {
          lVar1 = uVar2 * 4;
          uVar2 = uVar2 + 1;
        } while (*(int *)((long)text + lVar1 + 4) != 0);
        goto LAB_0010458d;
      }
    }
    uVar2 = 0;
  }
LAB_0010458d:
  it->text = text;
  it->length = (int)uVar2;
  it->encoding = encoding;
  it->index = 0;
  return;
}

Assistant:

void plutovg_text_iterator_init(plutovg_text_iterator_t* it, const void* text, int length, plutovg_text_encoding_t encoding)
{
    if(length == -1)
        length = plutovg_text_iterator_length(text, encoding);
    it->text = text;
    it->length = length;
    it->encoding = encoding;
    it->index = 0;
}